

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool google::protobuf::internal::MergeFromImpl<true>
               (ZeroCopyInputStream *input,MessageLite *msg,ParseFlags parse_flags)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  bool bVar3;
  ParseContext ctx;
  EpsCopyInputStream EStack_88;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  EStack_88.buffer_[0x18] = '\0';
  EStack_88.buffer_[0x19] = '\0';
  EStack_88.buffer_[0x1a] = '\0';
  EStack_88.buffer_[0x1b] = '\0';
  EStack_88.buffer_[0x1c] = '\0';
  EStack_88.buffer_[0x1d] = '\0';
  EStack_88.buffer_[0x1e] = '\0';
  EStack_88.buffer_[0x1f] = '\0';
  EStack_88.zcis_ = (ZeroCopyInputStream *)0x0;
  EStack_88.buffer_[0] = '\0';
  EStack_88.buffer_[1] = '\0';
  EStack_88.buffer_[2] = '\0';
  EStack_88.buffer_[3] = '\0';
  EStack_88.buffer_[4] = '\0';
  EStack_88.buffer_[5] = '\0';
  EStack_88.buffer_[6] = '\0';
  EStack_88.buffer_[7] = '\0';
  EStack_88.buffer_[8] = '\0';
  EStack_88.buffer_[9] = '\0';
  EStack_88.buffer_[10] = '\0';
  EStack_88.buffer_[0xb] = '\0';
  EStack_88.buffer_[0xc] = '\0';
  EStack_88.buffer_[0xd] = '\0';
  EStack_88.buffer_[0xe] = '\0';
  EStack_88.buffer_[0xf] = '\0';
  EStack_88.buffer_[0x10] = '\0';
  EStack_88.buffer_[0x11] = '\0';
  EStack_88.buffer_[0x12] = '\0';
  EStack_88.buffer_[0x13] = '\0';
  EStack_88.buffer_[0x14] = '\0';
  EStack_88.buffer_[0x15] = '\0';
  EStack_88.buffer_[0x16] = '\0';
  EStack_88.buffer_[0x17] = '\0';
  EStack_88.aliasing_ = 1;
  EStack_88.last_tag_minus_1_ = 0;
  EStack_88.overall_limit_ = 0x7fffffff;
  local_30 = io::CodedInputStream::default_recursion_limit_;
  local_2c = 0x80000000;
  local_28 = 0;
  uStack_20 = 0;
  pcVar2 = EpsCopyInputStream::InitFrom(&EStack_88,input);
  iVar1 = (*msg->_vptr_MessageLite[0xb])(msg,pcVar2,&EStack_88);
  bVar3 = false;
  if (((CONCAT44(extraout_var,iVar1) != 0) && (bVar3 = false, EStack_88.last_tag_minus_1_ == 1)) &&
     (bVar3 = true, (parse_flags & kMergePartial) == kMerge)) {
    iVar1 = (*msg->_vptr_MessageLite[6])(msg);
    if ((char)iVar1 == '\0') {
      MessageLite::LogInitializationErrorMessage(msg);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}